

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O2

void png_write_tIME(png_structrp png_ptr,png_const_timep mod_time)

{
  png_byte buf [7];
  
  buf[2] = mod_time->month;
  if ((((0xf3 < (byte)(buf[2] - 0xd)) && (buf[3] = mod_time->day, 0xe0 < (byte)(buf[3] - 0x20))) &&
      (buf[4] = mod_time->hour, buf[4] < 0x18)) && (buf[6] = mod_time->second, buf[6] < 0x3d)) {
    buf[0] = (png_byte)(mod_time->year >> 8);
    buf[1] = (png_byte)mod_time->year;
    buf[5] = mod_time->minute;
    png_write_complete_chunk(png_ptr,0x74494d45,buf,7);
    return;
  }
  png_warning(png_ptr,"Invalid time specified for tIME chunk");
  return;
}

Assistant:

void /* PRIVATE */
png_write_tIME(png_structrp png_ptr, png_const_timep mod_time)
{
   png_byte buf[7];

   png_debug(1, "in png_write_tIME");

   if (mod_time->month  > 12 || mod_time->month  < 1 ||
       mod_time->day    > 31 || mod_time->day    < 1 ||
       mod_time->hour   > 23 || mod_time->second > 60)
   {
      png_warning(png_ptr, "Invalid time specified for tIME chunk");
      return;
   }

   png_save_uint_16(buf, mod_time->year);
   buf[2] = mod_time->month;
   buf[3] = mod_time->day;
   buf[4] = mod_time->hour;
   buf[5] = mod_time->minute;
   buf[6] = mod_time->second;

   png_write_complete_chunk(png_ptr, png_tIME, buf, (png_size_t)7);
}